

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test::TestBody
          (DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test *this)

{
  bool bVar1;
  long *in_RDI;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  allocator *paVar3;
  int line;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  allocator local_89;
  string local_88 [16];
  Message *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  undefined1 local_68 [104];
  
  *(undefined4 *)(in_RDI + 0x17) = 500;
  *(undefined4 *)((long)in_RDI + 0xbc) = 500;
  *(undefined4 *)((long)in_RDI + 0xb4) = 1000;
  *(undefined4 *)((long)in_RDI + 0xac) = 0x14;
  *(undefined4 *)((long)in_RDI + 0xac) = 0x14;
  *(undefined4 *)((long)in_RDI + 0xa4) = 0;
  *(undefined4 *)(in_RDI + 0x15) = 0x32;
  *(undefined4 *)(in_RDI + 0xf) = 1;
  *(undefined4 *)(in_RDI + 0x14) = 200;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)(in_RDI + 9) = 1;
  *(undefined4 *)(in_RDI + 0x1b) = 9999;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x9a) = 100;
  paVar3 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",paVar3);
  uVar2 = 100;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,(int)((ulong)paVar3 >> 0x20),
             (int)paVar3,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  line = (int)((ulong)paVar3 >> 0x20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  (**(code **)(*in_RDI + 0x98))();
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff48);
    if (bVar1) {
      in_stack_ffffffffffffff44 = 2;
    }
    else {
      in_stack_ffffffffffffff44 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
    if ((in_stack_ffffffffffffff44 == 0) || (in_stack_ffffffffffffff44 != 2)) goto LAB_0079408d;
  }
  testing::Message::Message
            ((Message *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff3c,
             (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),line,
             (char *)in_RDI);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
  testing::Message::~Message((Message *)0x794047);
LAB_0079408d:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x79409a);
  return;
}

Assistant:

TEST_P(DatarateTestSetFrameQpRealtime, SetFrameQpOnePass) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.rc_undershoot_pct = 20;
  cfg_.rc_undershoot_pct = 20;
  cfg_.rc_min_quantizer = 0;
  cfg_.rc_max_quantizer = 50;
  cfg_.rc_end_usage = AOM_CBR;
  cfg_.rc_target_bitrate = 200;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 1;
  cfg_.kf_max_dist = 9999;
  cfg_.rc_dropframe_thresh = 0;

  total_frames_ = 100;
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 100);

  ResetModel();
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}